

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O2

QString * __thiscall
QWidgetLineControl::text(QString *__return_storage_ptr__,QWidgetLineControl *this)

{
  storage_type *psVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d = *(Data **)(this + 0x18);
  local_30.ptr = *(char16_t **)(this + 0x20);
  local_30.size = *(qsizetype *)(this + 0x28);
  if (local_30.d != (Data *)0x0) {
    LOCK();
    ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (*(long *)(this + 0xe8) == 0) {
    local_48.d = local_30.d;
    local_48.ptr = local_30.ptr;
    local_48.size = local_30.size;
    if (local_30.d != (Data *)0x0) {
      LOCK();
      ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    stripString((QString *)&local_48,this,(QString *)&local_30);
  }
  if (local_48.ptr == (char16_t *)0x0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("",1);
    QVar2.m_data = psVar1;
    QVar2.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar2);
  }
  else {
    (__return_storage_ptr__->d).d = local_48.d;
    (__return_storage_ptr__->d).ptr = local_48.ptr;
    (__return_storage_ptr__->d).size = local_48.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString text() const
    {
        QString content = m_text;
        QString res = m_maskData ? stripString(content) : content;
        return (res.isNull() ? QString::fromLatin1("") : res);
    }